

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<float,_10> * __thiscall
TPZManVector<float,_10>::operator=(TPZManVector<float,_10> *this,TPZManVector<float,_10> *rval)

{
  ulong uVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  
  if (this != rval) {
    uVar1 = (rval->super_TPZVec<float>).fNElements;
    pfVar2 = (this->super_TPZVec<float>).fStore;
    pfVar7 = this->fExtAlloc;
    if (pfVar2 != pfVar7 && pfVar2 != (float *)0x0) {
      operator_delete__(pfVar2);
      (this->super_TPZVec<float>).fStore = (float *)0x0;
    }
    if ((long)uVar1 < 0xb) {
      uVar5 = 0;
      uVar4 = 0;
      if (0 < (long)uVar1) {
        uVar4 = uVar1;
      }
      iVar3 = (int)uVar4;
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        pfVar7[uVar5] = rval->fExtAlloc[uVar5];
      }
      for (; uVar6 = 0, (uint)((10 - iVar3) + (int)uVar5) != uVar4; uVar4 = uVar4 + 1) {
        pfVar7[uVar4] = 0.0;
      }
    }
    else {
      pfVar7 = (rval->super_TPZVec<float>).fStore;
      uVar6 = uVar1;
    }
    (this->super_TPZVec<float>).fStore = pfVar7;
    (this->super_TPZVec<float>).fNAlloc = uVar6;
    (this->super_TPZVec<float>).fNElements = uVar1;
  }
  (rval->super_TPZVec<float>).fStore = (float *)0x0;
  (rval->super_TPZVec<float>).fNElements = 0;
  (rval->super_TPZVec<float>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}